

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockNodeHideHostWindow(ImGuiDockNode *node)

{
  ImGuiWindow_conflict *pIVar1;
  ImGuiWindow_conflict **ppIVar2;
  
  pIVar1 = node->HostWindow;
  if (pIVar1 != (ImGuiWindow_conflict *)0x0) {
    if (pIVar1->DockNodeAsHost == node) {
      pIVar1->DockNodeAsHost = (ImGuiDockNode *)0x0;
    }
    node->HostWindow = (ImGuiWindow_conflict *)0x0;
  }
  if ((node->Windows).Size == 1) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)&node->Windows,0);
    node->VisibleWindow = *ppIVar2;
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)&node->Windows,0);
    (*ppIVar2)->field_0x3e1 = (*ppIVar2)->field_0x3e1 & 0xfe;
  }
  if (node->TabBar != (ImGuiTabBar *)0x0) {
    DockNodeRemoveTabBar(node);
    return;
  }
  return;
}

Assistant:

static void ImGui::DockNodeHideHostWindow(ImGuiDockNode* node)
{
    if (node->HostWindow)
    {
        if (node->HostWindow->DockNodeAsHost == node)
            node->HostWindow->DockNodeAsHost = NULL;
        node->HostWindow = NULL;
    }

    if (node->Windows.Size == 1)
    {
        node->VisibleWindow = node->Windows[0];
        node->Windows[0]->DockIsActive = false;
    }

    if (node->TabBar)
        DockNodeRemoveTabBar(node);
}